

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O1

void Nwk_ManDelayTracePrint(Nwk_Man_t *pNtk)

{
  int *piVar1;
  If_LibLut_t *pIVar2;
  void **ppvVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  void *__s;
  long lVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pIVar2 = pNtk->pLutLib;
  if (pIVar2 == (If_LibLut_t *)0x0) {
    iVar7 = Nwk_ManLevelMax(pNtk);
    fVar15 = (float)iVar7;
  }
  else {
    iVar7 = pIVar2->LutMax;
    iVar5 = Nwk_ManGetFaninMax(pNtk);
    if (iVar7 < iVar5) {
      uVar11 = pIVar2->LutMax;
      uVar6 = Nwk_ManGetFaninMax(pNtk);
      printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar11,
             (ulong)uVar6);
      return;
    }
    fVar15 = 20.0;
  }
  fVar14 = (fVar15 + 1.0) * 4.0;
  uVar8 = (ulong)fVar14;
  uVar8 = (long)(fVar14 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
  __s = malloc(uVar8);
  memset(__s,0,uVar8);
  fVar14 = Nwk_ManDelayTraceLut(pNtk);
  lVar9 = (long)pNtk->vObjs->nSize;
  if (0 < lVar9) {
    ppvVar3 = pNtk->vObjs->pArray;
    lVar10 = 0;
    do {
      pvVar4 = ppvVar3[lVar10];
      if ((((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x20) & 7) == 3)) &&
          (*(int *)((long)pvVar4 + 0x3c) != 0)) &&
         (fVar16 = *(float *)((long)pvVar4 + 0x38) / (fVar14 / fVar15), fVar16 <= fVar15)) {
        if ((fVar16 < 0.0) || (fVar15 < fVar16)) {
          __assert_fail("Num >=0 && Num <= nSteps",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                        ,0x1e7,"void Nwk_ManDelayTracePrint(Nwk_Man_t *)");
        }
        piVar1 = (int *)((long)__s + (long)(int)fVar16 * 4);
        *piVar1 = *piVar1 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  pcVar12 = "LUT library";
  if (pIVar2 == (If_LibLut_t *)0x0) {
    pcVar12 = "unit-delay";
  }
  printf("Max delay = %6.2f. Delay trace using %s model:\n",(double)fVar14,pcVar12);
  if (0.0 < fVar15) {
    pcVar12 = "%";
    if (pIVar2 == (If_LibLut_t *)0x0) {
      pcVar12 = "lev";
    }
    uVar8 = 0;
    uVar11 = 5;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + *(int *)((long)__s + uVar8 * 4);
      uVar8 = uVar8 + 1;
      uVar13 = (ulong)uVar11;
      if (pIVar2 == (If_LibLut_t *)0x0) {
        uVar13 = uVar8 & 0xffffffff;
      }
      printf("%3d %s : %5d  (%6.2f %%)\n",((double)(int)uVar6 * 100.0) / (double)pNtk->nObjs[3],
             uVar13,pcVar12,(ulong)uVar6);
      uVar11 = uVar11 + 5;
    } while ((float)(int)uVar8 < fVar15);
  }
  if (__s != (void *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Nwk_ManDelayTracePrint( Nwk_Man_t * pNtk )
{
    If_LibLut_t * pLutLib = pNtk->pLutLib;
    Nwk_Obj_t * pNode;
    int i, Nodes, * pCounters;
    float tArrival, tDelta, nSteps, Num;
    // get the library
    if ( pLutLib && pLutLib->LutMax < Nwk_ManGetFaninMax(pNtk) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Nwk_ManGetFaninMax(pNtk) );
        return;
    }
    // decide how many steps
    nSteps = pLutLib ? 20 : Nwk_ManLevelMax(pNtk);
    pCounters = ABC_ALLOC( int, nSteps + 1 );
    memset( pCounters, 0, sizeof(int)*(nSteps + 1) );
    // perform delay trace
    tArrival = Nwk_ManDelayTraceLut( pNtk );
    tDelta = tArrival / nSteps;
    // count how many nodes have slack in the corresponding intervals
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        if ( Nwk_ObjFaninNum(pNode) == 0 )
            continue;
        Num = Nwk_ObjSlack(pNode) / tDelta;
        if ( Num > nSteps )
            continue;
        assert( Num >=0 && Num <= nSteps );
        pCounters[(int)Num]++;
    }
    // print the results
    printf( "Max delay = %6.2f. Delay trace using %s model:\n", tArrival, pLutLib? "LUT library" : "unit-delay" );
    Nodes = 0;
    for ( i = 0; i < nSteps; i++ )
    {
        Nodes += pCounters[i];
        printf( "%3d %s : %5d  (%6.2f %%)\n", pLutLib? 5*(i+1) : i+1, 
            pLutLib? "%":"lev", Nodes, 100.0*Nodes/Nwk_ManNodeNum(pNtk) );
    }
    ABC_FREE( pCounters );
}